

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,int n)

{
  ImGuiContext *pIVar1;
  long lVar2;
  uint uVar3;
  int local_c;
  
  pIVar1 = GImGui;
  local_c = n;
  uVar3 = ~(this->IDStack).Data[(long)(this->IDStack).Size + -1];
  lVar2 = 0;
  do {
    uVar3 = uVar3 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar2) ^ uVar3 & 0xff];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  uVar3 = ~uVar3;
  if (GImGui->ActiveId == uVar3) {
    GImGui->ActiveIdIsAlive = uVar3;
  }
  if (pIVar1->ActiveIdPreviousFrame == uVar3) {
    pIVar1->ActiveIdPreviousFrameIsAlive = true;
  }
  if (pIVar1->DebugHookIdInfo == uVar3) {
    ImGui::DebugHookIdInfo(uVar3,4,(void *)(long)n,(void *)0x0);
  }
  return uVar3;
}

Assistant:

ImGuiID ImGuiWindow::GetID(int n)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&n, sizeof(n), seed);
    ImGui::KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_S32, (void*)(intptr_t)n, NULL);
    return id;
}